

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_blitter.cpp
# Opt level: O2

void __thiscall
QBlittablePlatformPixmap::fromImage
          (QBlittablePlatformPixmap *this,QImage *image,ImageConversionFlags flags)

{
  qreal qVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Format FVar6;
  Format FVar7;
  undefined4 extraout_var;
  uchar *__dest;
  uchar *__src;
  qsizetype qVar8;
  size_t __n;
  long lVar9;
  long in_FS_OFFSET;
  QImage local_70;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  QImage *this_00;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QImage::hasAlphaChannel(image);
  this->m_alpha = bVar2;
  qVar1 = QImage::devicePixelRatio(image);
  this->m_devicePixelRatio = qVar1;
  uVar3 = QImage::width(image);
  uVar4 = QImage::height(image);
  (*(this->super_QPlatformPixmap)._vptr_QPlatformPixmap[3])(this,(ulong)uVar3,(ulong)uVar4);
  iVar5 = (*(this->super_QPlatformPixmap)._vptr_QPlatformPixmap[0x16])(this);
  this_00 = (QImage *)CONCAT44(extraout_var,iVar5);
  local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_58,image);
  FVar6 = QImage::format((QImage *)local_58);
  FVar7 = QImage::format(this_00);
  if (FVar6 != FVar7) {
    FVar6 = QImage::format(this_00);
    QImage::convertToFormat_helper(&local_70,(QImage *)local_58,FVar6,flags);
    QImage::operator=((QImage *)local_58,&local_70);
    QImage::~QImage(&local_70);
  }
  __dest = QImage::bits(this_00);
  __src = QImage::constBits((QImage *)local_58);
  lVar9 = 0;
  while( true ) {
    qVar8 = QImage::sizeInBytes((QImage *)local_58);
    if (qVar8 <= lVar9) break;
    __n = QImage::bytesPerLine((QImage *)local_58);
    memcpy(__dest,__src,__n);
    qVar8 = QImage::bytesPerLine(this_00);
    __dest = __dest + qVar8;
    qVar8 = QImage::bytesPerLine((QImage *)local_58);
    __src = __src + qVar8;
    qVar8 = QImage::bytesPerLine((QImage *)local_58);
    lVar9 = lVar9 + qVar8;
  }
  QImage::~QImage((QImage *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBlittablePlatformPixmap::fromImage(const QImage &image,
                                     Qt::ImageConversionFlags flags)
{
    m_alpha = image.hasAlphaChannel();
    m_devicePixelRatio = image.devicePixelRatio();
    resize(image.width(),image.height());
    markRasterOverlay(QRect(0,0,w,h));
    QImage *thisImg = buffer();

    QImage correctFormatPic = image;
    if (correctFormatPic.format() != thisImg->format())
        correctFormatPic = correctFormatPic.convertToFormat(thisImg->format(), flags);

    uchar *mem = thisImg->bits();
    const uchar *bits = correctFormatPic.constBits();
    qsizetype bytesCopied = 0;
    while (bytesCopied < correctFormatPic.sizeInBytes()) {
        memcpy(mem,bits,correctFormatPic.bytesPerLine());
        mem += thisImg->bytesPerLine();
        bits += correctFormatPic.bytesPerLine();
        bytesCopied+=correctFormatPic.bytesPerLine();
    }
}